

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# work_lda_inc.c
# Opt level: O1

void work_lda_fxc_unpol(xc_func_type *p,size_t np,double *rho,xc_lda_out_params *out)

{
  double *pdVar1;
  long lVar2;
  size_t sVar3;
  ulong uVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double __x;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double __x_00;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  double dVar48;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  double dVar51;
  double dVar52;
  double dVar53;
  double dVar54;
  double dVar55;
  double dVar56;
  double dVar57;
  double dVar58;
  double dVar59;
  double dVar60;
  double dVar61;
  double dVar62;
  double dVar63;
  double dVar64;
  double dVar65;
  double dVar66;
  double dVar67;
  undefined1 auVar68 [16];
  double dVar69;
  double dVar70;
  double dVar71;
  double dVar72;
  double dVar73;
  double dVar74;
  double dVar75;
  undefined1 auVar76 [16];
  double dVar77;
  double dVar78;
  double dVar79;
  double dVar80;
  undefined1 auVar81 [16];
  double dVar82;
  double dVar83;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  double dVar86;
  double dVar87;
  double dVar88;
  double dVar89;
  double dVar90;
  double dVar91;
  double dVar92;
  double local_438;
  double local_388;
  double local_258;
  double local_108;
  double dStack_100;
  double local_f8;
  double dStack_f0;
  double local_d8;
  double dStack_d0;
  double local_b8;
  double local_98;
  double dStack_90;
  
  if (np != 0) {
    sVar3 = 0;
    do {
      if (p->nspin == 2) {
        lVar2 = (long)(p->dim).rho * sVar3;
        dVar30 = rho[lVar2] + rho[lVar2 + 1];
      }
      else {
        dVar30 = rho[(long)(p->dim).rho * sVar3];
      }
      dVar11 = p->dens_threshold;
      if (dVar11 <= dVar30) {
        dVar30 = rho[(long)(p->dim).rho * sVar3];
        if (rho[(long)(p->dim).rho * sVar3] <= dVar11) {
          dVar30 = dVar11;
        }
        dVar5 = cbrt(0.3183098861837907);
        dVar6 = dVar5 * 1.4422495703074083;
        dVar7 = dVar6 * 2.519842099789747;
        dVar11 = p->zeta_threshold;
        dVar31 = 1.0;
        dVar8 = 1.0;
        if (1.0 <= dVar11) {
          dVar8 = cbrt(dVar11);
          dVar31 = dVar11 * dVar8;
        }
        dVar9 = dVar31 * 1.5874010519681996;
        dVar10 = cbrt(dVar30);
        dVar11 = cbrt(9.0);
        dVar32 = dVar5 * dVar5;
        dVar51 = p->cam_omega * dVar32 * dVar11 * dVar11;
        auVar49._8_8_ = dVar10;
        auVar49._0_8_ = dVar8;
        auVar49 = divpd(_DAT_01041040,auVar49);
        dVar8 = auVar49._0_8_;
        dVar79 = auVar49._8_8_;
        dVar33 = (dVar8 * dVar79 * 1.4422495703074083 * dVar51) / 18.0;
        dVar11 = 1.92;
        if (dVar33 <= 1.92) {
          dVar11 = dVar33;
        }
        dVar12 = atan2(1.0,dVar11);
        dVar34 = dVar11 * dVar11;
        dVar13 = 1.0 / dVar34;
        __x = dVar13 + 1.0;
        dVar14 = log(__x);
        dVar89 = dVar33;
        if (dVar33 <= 1.92) {
          dVar89 = 1.92;
        }
        dVar74 = dVar89 * dVar89;
        dVar90 = dVar74 * dVar74;
        dVar91 = dVar90 * dVar90;
        dVar86 = dVar90 * dVar74;
        dVar88 = dVar91 * dVar91;
        auVar50._0_8_ = dVar91 * dVar74;
        auVar50._8_8_ = dVar90 * dVar91;
        auVar68._0_8_ = dVar86 * dVar91;
        auVar68._8_8_ = dVar88;
        auVar68 = divpd(_DAT_01041040,auVar68);
        dVar69 = auVar68._8_8_;
        auVar81._8_8_ = dVar69;
        auVar81._0_8_ = dVar69;
        auVar81 = divpd(auVar81,auVar50);
        auVar76._0_8_ = dVar91 * dVar86;
        auVar76._8_8_ = dVar88 * dVar88;
        auVar24._8_8_ = dVar90;
        auVar24._0_8_ = dVar74;
        auVar84._8_8_ = dVar91;
        auVar84._0_8_ = dVar86;
        auVar26._8_8_ = dVar69;
        auVar26._0_8_ = dVar69;
        auVar84 = divpd(auVar26,auVar84);
        auVar85._8_8_ = 0x3ff0000000000000;
        auVar85._0_8_ = dVar69;
        auVar76 = divpd(auVar85,auVar76);
        auVar27._8_8_ = dVar69;
        auVar27._0_8_ = dVar69;
        auVar85 = divpd(auVar27,auVar24);
        dVar77 = auVar76._8_8_;
        auVar25._8_8_ = dVar77;
        auVar25._0_8_ = dVar77;
        auVar49 = divpd(auVar25,auVar24);
        dVar88 = dVar34 + 3.0;
        dVar35 = 1.0 - dVar14 * dVar88;
        dVar12 = dVar11 * dVar35 * 0.25 + dVar12;
        if (dVar33 < 1.92) {
          local_438 = dVar12 * -2.6666666666666665 * dVar11 + 1.0;
        }
        else {
          auVar24 = divpd(auVar68,_DAT_0105cb40);
          auVar25 = divpd(auVar85,_DAT_0105cb50);
          auVar26 = divpd(auVar84,_DAT_0105cb60);
          auVar27 = divpd(auVar81,_DAT_0105cb70);
          auVar28 = divpd(auVar76,_DAT_0105cb80);
          auVar29 = divpd(auVar49,_DAT_0105cb90);
          local_438 = ((((((((((((1.0 / auVar50._8_8_) / -364.0 +
                                 (1.0 / auVar50._0_8_) / 231.0 +
                                 (1.0 / dVar91) / -135.0 +
                                 (1.0 / dVar86) / 70.0 +
                                 (1.0 / dVar90) / -30.0 + (1.0 / dVar74) / 9.0 + auVar24._0_8_) -
                               auVar24._8_8_) + auVar25._0_8_) - auVar25._8_8_) + auVar26._0_8_) -
                           auVar26._8_8_) + auVar27._0_8_) - auVar27._8_8_) + auVar28._0_8_) -
                       auVar28._8_8_) + auVar29._0_8_) - auVar29._8_8_;
        }
        dVar36 = dVar79 * 2.519842099789747 * dVar6;
        dVar15 = dVar36 * 0.053425 + 1.0;
        dVar16 = SQRT(dVar36);
        dVar17 = dVar16;
        if (dVar36 < 0.0) {
          dVar17 = sqrt(dVar36);
          dVar16 = sqrt(dVar36);
        }
        dVar52 = dVar32 * 2.080083823051904;
        dVar37 = 1.0 / (dVar10 * dVar10);
        dVar38 = dVar37 * 1.5874010519681996 * dVar52;
        dVar39 = dVar38 * 0.123235 + dVar16 * dVar36 * 0.204775 + dVar17 * 3.79785 + dVar36 * 0.8969
        ;
        __x_00 = 16.081979498692537 / dVar39 + 1.0;
        dVar18 = log(__x_00);
        dVar31 = (dVar31 + dVar31 + -2.0) * 1.9236610509315362;
        dVar53 = dVar36 * 0.0278125 + 1.0;
        dVar40 = dVar38 * 0.1241775 +
                 dVar16 * dVar36 * 0.1100325 + dVar17 * 5.1785 + dVar36 * 0.905775;
        dVar16 = 29.608749977793437 / dVar40 + 1.0;
        dVar19 = log(dVar16);
        dVar41 = dVar18 * -0.0621814 * dVar15 + dVar19 * 0.0197516734986138 * dVar53 * dVar31;
        dVar38 = dVar38 * 0.25 + dVar36 * -0.225 + 3.2;
        dVar66 = 1.0 / dVar38;
        dVar54 = local_438 * -0.1875 * dVar10 * dVar9 * dVar7 + dVar66 * 3.4602 * dVar41;
        pdVar1 = out->zk;
        if ((pdVar1 != (double *)0x0) && ((p->info->flags & 1) != 0)) {
          lVar2 = (long)(p->dim).zk * sVar3;
          pdVar1[lVar2] = pdVar1[lVar2] + dVar54;
        }
        dVar74 = dVar74 * dVar89;
        dVar42 = dVar79 / dVar30;
        dVar20 = (dVar8 * dVar42 * 1.4422495703074083 * dVar51) / -54.0;
        local_388 = dVar20;
        if (dVar33 <= 1.92) {
          local_388 = 0.0;
        }
        dVar43 = dVar89 * dVar90;
        dVar71 = dVar90 * dVar74;
        dVar87 = 1.0 / (dVar89 * dVar91);
        dVar70 = 1.0 / (dVar74 * dVar91);
        dVar78 = 1.0 / (dVar91 * dVar43);
        dVar75 = 1.0 / (dVar91 * dVar71);
        dVar72 = dVar69 / (dVar89 * dVar91);
        dVar55 = dVar69 / (dVar74 * dVar91);
        dVar56 = dVar69 / (dVar91 * dVar43);
        dVar61 = dVar69 / (dVar91 * dVar71);
        uVar4 = -(ulong)(1.92 < dVar33);
        dVar20 = (double)(~uVar4 & (ulong)dVar20);
        auVar28._0_8_ = dVar11 * dVar34;
        auVar28._8_8_ = __x;
        auVar24 = divpd(_DAT_01041040,auVar28);
        dVar57 = dVar88 * auVar24._0_8_;
        dVar92 = auVar24._8_8_;
        dVar14 = dVar14 * -2.0;
        dVar82 = dVar14 * dVar20 * dVar11 + (dVar20 * dVar92 + dVar20 * dVar92) * dVar57;
        dVar83 = dVar11 * dVar82 * 0.25 + (dVar20 * dVar35 * 0.25 - dVar13 * dVar92 * dVar20);
        if (dVar33 < 1.92) {
          dVar58 = dVar12 * -2.6666666666666665 * dVar20 + dVar83 * -2.6666666666666665 * dVar11;
        }
        else {
          dVar58 = local_388 * 0.005120910384068279 * (dVar77 / dVar43) +
                   local_388 * -0.0056808688387635755 * (dVar77 / dVar74) +
                   local_388 * 0.006337888690829867 * (dVar77 / dVar89) +
                   local_388 * -0.007115749525616698 * dVar61 +
                   local_388 * 0.008045977011494253 * dVar56 +
                   local_388 * -0.009171075837742505 * dVar55 +
                   local_388 * 0.01054945054945055 * dVar72 +
                   local_388 * -0.012263099219620958 * (dVar69 / dVar71) +
                   local_388 * 0.01443001443001443 * (dVar69 / dVar43) +
                   local_388 * -0.01722488038277512 * (dVar69 / dVar74) +
                   local_388 * 0.02091503267973856 * (dVar69 / dVar89) +
                   local_388 * -0.025925925925925925 * dVar75 +
                   local_388 * 0.03296703296703297 * dVar78 +
                   local_388 * -0.04329004329004329 * dVar70 +
                   local_388 * 0.05925925925925926 * dVar87 +
                   local_388 * -0.08571428571428572 * (1.0 / dVar71) +
                   local_388 * -0.2222222222222222 * (1.0 / dVar74) +
                   local_388 * 0.13333333333333333 * (1.0 / dVar43);
        }
        dVar21 = dVar10 * dVar58 * dVar9 * dVar7;
        dVar65 = dVar42 * 2.519842099789747;
        dVar22 = dVar39 * dVar39;
        dVar67 = dVar15 * (1.0 / dVar22);
        dVar5 = dVar5 * 2.519842099789747;
        dVar44 = dVar5 * dVar42 * (1.4422495703074083 / dVar17);
        dVar80 = dVar6 * dVar65;
        if (dVar36 < 0.0) {
          dVar45 = sqrt(dVar36);
        }
        else {
          dVar45 = SQRT(dVar36);
        }
        dVar73 = dVar5 * dVar42 * dVar45 * 1.4422495703074083;
        dVar23 = (dVar37 / dVar30) * 1.5874010519681996 * dVar52;
        dVar59 = dVar23 * -0.08215666666666667 +
                 dVar73 * -0.1023875 + dVar44 * -0.632975 + dVar80 * -0.29896666666666666;
        dVar46 = 1.0 / __x_00;
        dVar53 = dVar53 * dVar31;
        dVar47 = dVar40 * dVar40;
        dVar73 = dVar23 * -0.082785 +
                 dVar73 * -0.05501625 + dVar44 * -0.8630833333333333 + dVar80 * -0.301925;
        dVar62 = 1.0 / dVar16;
        dVar63 = dVar62 * dVar73 * (1.0 / dVar47);
        dVar48 = dVar63 * -0.5848223622634646 * dVar53 +
                 dVar19 * -0.00018311447306006544 * dVar42 * dVar5 * dVar31 * 1.4422495703074083 +
                 dVar18 * 0.0011073470983333333 * dVar65 * dVar6 + dVar67 * dVar46 * dVar59;
        dVar64 = dVar66 * dVar48;
        dVar60 = 1.0 / (dVar38 * dVar38);
        dVar23 = dVar80 * 0.075 + dVar23 / -6.0;
        dVar44 = dVar23 * dVar60 * dVar41;
        dVar80 = -local_438 * dVar37 * dVar9 * dVar7;
        pdVar1 = out->vrho;
        if ((pdVar1 != (double *)0x0) && ((p->info->flags & 2) != 0)) {
          lVar2 = (long)(p->dim).vrho * sVar3;
          pdVar1[lVar2] =
               (dVar44 * -3.4602 + dVar64 * 3.4602 + dVar21 * -0.1875 + dVar80 * 0.0625) * dVar30 +
               dVar54 + pdVar1[lVar2];
        }
        dVar79 = dVar79 / (dVar30 * dVar30);
        dVar51 = dVar51 * dVar8 * 0.024691358024691357 * dVar79 * 1.4422495703074083;
        if (dVar33 < 1.92) {
          dVar89 = 1.0 / (__x * __x);
          dVar8 = 1.0 / (dVar34 * dVar34);
          dVar51 = (double)(~uVar4 & (ulong)dVar51);
          dVar33 = dVar20 * dVar20;
          dVar11 = ((dVar33 * dVar14 +
                     (dVar51 * dVar92 + dVar51 * dVar92) * dVar57 +
                     dVar92 * 8.0 * dVar33 * dVar13 + dVar14 * dVar51 * dVar11 +
                     dVar8 * dVar88 * dVar33 * dVar92 * -6.0 +
                    (dVar8 / dVar34) * dVar88 * dVar89 * dVar33 * 4.0) * dVar11 * 0.25 +
                   dVar35 * dVar51 * 0.25 +
                   (dVar8 / dVar11) * dVar89 * -2.0 * dVar33 +
                   dVar51 * dVar13 * -dVar92 + dVar92 * 2.0 * dVar33 * auVar24._0_8_ +
                   dVar82 * dVar20 * 0.5) * -2.6666666666666665 * dVar11 +
                   dVar12 * -2.6666666666666665 * dVar51 + dVar83 * -5.333333333333333 * dVar20;
        }
        else {
          dVar51 = (double)(uVar4 & (ulong)dVar51);
          local_388 = local_388 * local_388;
          local_108 = auVar85._0_8_;
          dStack_100 = auVar85._8_8_;
          local_f8 = auVar84._0_8_;
          dStack_f0 = auVar84._8_8_;
          local_d8 = auVar81._0_8_;
          dStack_d0 = auVar81._8_8_;
          local_b8 = auVar76._0_8_;
          local_98 = auVar49._0_8_;
          dStack_90 = auVar49._8_8_;
          local_258 = auVar68._0_8_;
          dVar11 = local_258 * local_388 * -0.42857142857142855 +
                   (1.0 / auVar50._8_8_) * local_388 * 0.47619047619047616 +
                   (1.0 / auVar50._0_8_) * local_388 * -0.5333333333333333 +
                   (1.0 / dVar91) * local_388 * 0.6 +
                   (1.0 / dVar86) * -(local_388 * 0.6666666666666666) +
                   (1.0 / dVar90) * local_388 * 0.6666666666666666 +
                   dStack_90 * local_388 * 0.19883040935672514 +
                   local_98 * local_388 * -0.20915032679738563 +
                   dVar77 * local_388 * 0.22058823529411764 +
                   local_b8 * local_388 * -0.23333333333333334 +
                   dStack_d0 * local_388 * 0.24761904761904763 +
                   local_d8 * local_388 * -0.26373626373626374 +
                   dStack_f0 * local_388 * 0.28205128205128205 +
                   local_f8 * local_388 * -0.30303030303030304 +
                   dStack_100 * local_388 * 0.32727272727272727 +
                   dVar69 * local_388 * 0.3888888888888889 +
                   local_108 * local_388 * -0.35555555555555557 +
                   local_388 * -0.18947368421052632 * (dVar77 / dVar86) +
                   (dVar77 / dVar43) * dVar51 * 0.005120910384068279 +
                   (dVar77 / dVar74) * dVar51 * -0.0056808688387635755 +
                   (dVar77 / dVar89) * dVar51 * 0.006337888690829867 +
                   dVar61 * dVar51 * -0.007115749525616698 +
                   dVar51 * dVar56 * 0.008045977011494253 +
                   dVar55 * dVar51 * -0.009171075837742505 +
                   (dVar69 / dVar71) * dVar51 * -0.012263099219620958 +
                   (dVar69 / dVar43) * dVar51 * 0.01443001443001443 +
                   (dVar69 / dVar74) * dVar51 * -0.01722488038277512 +
                   (dVar69 / dVar89) * dVar51 * 0.02091503267973856 +
                   dVar75 * dVar51 * -0.025925925925925925 +
                   dVar78 * dVar51 * 0.03296703296703297 +
                   dVar70 * dVar51 * -0.04329004329004329 +
                   dVar87 * dVar51 * 0.05925925925925926 +
                   (1.0 / dVar71) * dVar51 * -0.08571428571428572 +
                   (1.0 / dVar74) * dVar51 * -0.2222222222222222 +
                   (1.0 / dVar43) * dVar51 * 0.13333333333333333 +
                   dVar72 * dVar51 * 0.01054945054945055;
        }
        dVar89 = dVar37 / (dVar30 * dVar30);
        dVar8 = dVar32 * 1.5874010519681996 * dVar89;
        dVar51 = ((2.080083823051904 / dVar17) / dVar36) * dVar8;
        dVar32 = (1.4422495703074083 / dVar17) * dVar5 * dVar79;
        dVar33 = dVar6 * dVar79 * 2.519842099789747;
        if (dVar36 < 0.0) {
          dVar36 = sqrt(dVar36);
        }
        else {
          dVar36 = SQRT(dVar36);
        }
        dVar8 = dVar8 * (1.0 / dVar36) * 2.080083823051904;
        dVar13 = dVar5 * dVar79 * dVar45 * 1.4422495703074083;
        dVar52 = dVar52 * dVar89 * 1.5874010519681996;
        pdVar1 = out->v2rho2;
        if ((pdVar1 != (double *)0x0) && ((p->info->flags & 4) != 0)) {
          lVar2 = (long)(p->dim).v2rho2 * sVar3;
          pdVar1[lVar2] =
               ((dVar33 * -0.1 + dVar52 * 0.2777777777777778) * dVar60 * dVar41 * -3.4602 +
               dVar23 * dVar23 * (dVar60 / dVar38) * dVar41 * 6.9204 +
               dVar48 * dVar60 * dVar23 * -6.9204 +
               dVar66 * ((1.0 / (dVar16 * dVar16)) * (1.0 / (dVar47 * dVar47)) * dVar73 * dVar73 *
                         -17.315859105681465 * dVar53 +
                        (1.0 / dVar47) *
                        (dVar52 * 0.137975 +
                        dVar13 * 0.073355 +
                        dVar8 * 0.0366775 +
                        dVar33 * 0.4025666666666667 +
                        dVar51 * -0.5753888888888888 + dVar32 * 1.1507777777777777) * dVar62 *
                        -0.5848223622634646 * dVar53 +
                        dVar62 * dVar73 * dVar73 * (1.0 / (dVar40 * dVar47)) * 1.1696447245269292 *
                        dVar53 + dVar65 * dVar63 * 0.01084358130030174 * dVar31 * dVar6 +
                                 dVar5 * dVar79 * dVar19 * 0.00024415263074675396 *
                                 dVar31 * 1.4422495703074083 +
                                 (1.0 / (__x_00 * __x_00)) * dVar59 * dVar59 * 16.081979498692537 *
                                 dVar15 * (1.0 / (dVar22 * dVar22)) +
                                 dVar46 * (dVar52 * 0.1369277777777778 +
                                          dVar13 * 0.13651666666666668 +
                                          dVar8 * 0.06825833333333334 +
                                          dVar33 * 0.3986222222222222 +
                                          dVar51 * -0.4219833333333333 + dVar32 * 0.8439666666666666
                                          ) * dVar67 +
                                 dVar46 * dVar59 * dVar59 * -2.0 *
                                 (1.0 / (dVar39 * dVar22)) * dVar15 +
                                 dVar79 * 2.519842099789747 * dVar18 * -0.0014764627977777779 *
                                 dVar6 + dVar42 * (1.0 / dVar22) *
                                         dVar46 * dVar59 * -0.035616666666666665 * dVar7) * 3.4602 +
               dVar10 * dVar11 * dVar9 * dVar7 * -0.1875 +
               (((dVar37 / dVar30) * local_438 * dVar9 * dVar7) / 24.0 -
               dVar7 * dVar9 * dVar37 * dVar58 * 0.125)) * dVar30 +
               dVar44 * -6.9204 + dVar64 * 6.9204 + dVar21 * -0.375 + dVar80 * 0.125 + pdVar1[lVar2]
          ;
        }
      }
      sVar3 = sVar3 + 1;
    } while (np != sVar3);
  }
  return;
}

Assistant:

static void
WORK_LDA(ORDER_TXT, SPIN_TXT)
(const XC(func_type) *p, size_t np, const double *rho, xc_lda_out_params *out)
{

#ifdef XC_DEBUG
  /* This throws an exception when floating point errors are encountered */
  /*feenableexcept(FE_DIVBYZERO | FE_INVALID);*/
#endif

  size_t ip;
  double dens;
  double my_rho[2] = {0.0, 0.0};

  for(ip = 0; ip < np; ip++){
    /* Screen low density */
    dens = (p->nspin == XC_POLARIZED) ? VAR(rho, ip, 0) + VAR(rho, ip, 1) : VAR(rho, ip, 0);
    if(dens < p->dens_threshold)
      continue;
    
    /* sanity check of input parameters */
    my_rho[0] = m_max(p->dens_threshold, VAR(rho, ip, 0));
    if(p->nspin == XC_POLARIZED){
      my_rho[1] = m_max(p->dens_threshold, VAR(rho, ip, 1));
    }

    FUNC(ORDER_TXT, SPIN_TXT)(p, ip, my_rho, out);

    /* check for NaNs */
#ifdef XC_DEBUG
    {
      const xc_dimensions *dim = &(p->dim);
      int ii, is_OK = 1;

      if(out->zk != NULL)
        is_OK = is_OK & isfinite(out->VAR(zk, ip, 0));

      if(out->vrho != NULL){
        for(ii=0; ii < dim->vrho; ii++)
          is_OK = is_OK && isfinite(out->VAR(vrho, ip, ii));
      }

      if(!is_OK){
        printf("Problem in the evaluation of the functional\n");
        if(p->nspin == XC_UNPOLARIZED){
          printf("./xc-get_data %d 1 %le 0.0 0.0 0.0 0.0 0.0 0.0 0.0 0.0\n",
                 p->info->number, VAR(rho, ip, 0));
        }else{
          printf("./xc-get_data %d 2 %le %le 0.0 0.0 0.0 0.0 0.0 0.0 0.0\n",
                 p->info->number, VAR(rho, ip, 0), VAR(rho, ip, 1));
        }
      }
    }
#endif
  }   /* for(ip) */

}